

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_10::DartCodeGenerator::~DartCodeGenerator(DartCodeGenerator *this)

{
  DartCodeGenerator *this_local;
  
  ~DartCodeGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateDart(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }